

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O3

double TestSpectra::DD_spectrum
                 (double xMin,double xMax,double expFall,double peakFrac,double peakMu,
                 double peakSig,double peakSkew)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pdVar3;
  RandomGen *pRVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar5;
  ulong in_XMM3_Qb;
  ulong in_XMM4_Qb;
  undefined1 auVar6 [16];
  initializer_list<double> __l;
  allocator_type local_c1;
  double local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  double local_a0;
  undefined1 local_98 [16];
  pointer local_88;
  undefined1 local_78 [16];
  double local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  undefined1 local_28 [16];
  double local_18;
  undefined8 uStack_10;
  
  local_50 = 80.0;
  if (xMax <= 80.0) {
    local_50 = xMax;
  }
  local_18 = 0.0;
  if (0.0 <= xMin) {
    local_18 = xMin;
  }
  uStack_10 = 0;
  auVar6._0_8_ = ~-(ulong)(peakMu < local_50) & 0x3ff0000000000000;
  auVar6._8_8_ = 0;
  auVar1._8_4_ = (int)(in_XMM3_Qb & in_XMM4_Qb);
  auVar1._0_8_ = (ulong)(peakFrac + 1.0) & -(ulong)(peakMu < local_50);
  auVar1._12_4_ = (int)((in_XMM3_Qb & in_XMM4_Qb) >> 0x20);
  local_28 = auVar6 | auVar1;
  local_68 = local_50 - local_18;
  uStack_60 = 0;
  local_c0 = peakSig;
  local_a0 = peakMu;
  local_48 = peakFrac;
  local_40 = expFall;
  local_38 = peakSkew;
  pRVar4 = RandomGen::rndm();
  dVar5 = RandomGen::rand_uniform(pRVar4);
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_8_ = dVar5;
  local_78._12_4_ = extraout_XMM0_Dd;
  pRVar4 = RandomGen::rndm();
  dVar5 = RandomGen::rand_uniform(pRVar4);
  dVar5 = dVar5 * (double)local_28._0_8_ + 0.0;
  local_98._8_4_ = SUB84(dVar5,0);
  local_98._0_8_ = local_18 + (double)local_78._0_8_ * local_68;
  local_98._12_4_ = (int)((ulong)dVar5 >> 0x20);
  local_88 = (pointer)0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__l,&local_c1);
  if (0.0 < local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[2]) {
    do {
      local_68 = exp(-*local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start / local_40);
      dVar5 = (*local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start - local_a0) / local_c0;
      local_30 = exp(-dVar5 * dVar5);
      dVar5 = erf(((*local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start - local_a0) * local_38) / local_c0);
      local_78._0_8_ = dVar5;
      pRVar4 = RandomGen::rndm();
      RandomGen::VonNeumann
                ((vector<double,_std::allocator<double>_> *)local_98,pRVar4,local_18,local_50,0.0,
                 (double)local_28._0_8_,
                 *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1],
                 ((double)local_78._0_8_ + 1.0) * local_30 * local_48 + local_68);
      pdVar3 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar2 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_98._0_8_;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_98._8_8_;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_88;
      local_98 = ZEXT816(0);
      local_88 = (pointer)0x0;
      if (pdVar2 != (double *)0x0) {
        operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
        if ((pointer)local_98._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_98._0_8_,(long)local_88 - local_98._0_8_);
        }
      }
    } while (0.0 < local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[2]);
  }
  local_c0 = *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return local_c0;
}

Assistant:

double TestSpectra::DD_spectrum(double xMin, double xMax, double expFall,
                                double peakFrac, double peakMu,
                                double peakSig, double peakSkew) {
  // JV LUX, most closely like JENDL-4. See arXiv:1608.05381. Lower than
  // G4/LUXSim
  if (xMax > 80.) xMax = 80.;
  if (xMin < 0.000) xMin = 0.000;
  double yMin = 0.0;
  double yMax = 1.; if ( peakMu < xMax ) yMax += peakFrac;
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMin + (yMax - yMin) * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double FuncValue = exp(-xyTry[0] / expFall) +
                       peakFrac * exp(-pow((xyTry[0] - peakMu) / peakSig, 2.))*(erf(peakSkew*(xyTry[0] - peakMu) / peakSig)+1);
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, yMin, yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}